

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O0

void __thiscall QColorDialogPrivate::newHsv(QColorDialogPrivate *this,int h,int s,int v)

{
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  undefined4 in_stack_00000010;
  int in_stack_00000078;
  int in_stack_0000007c;
  int v_00;
  int in_stack_ffffffffffffffe8;
  
  if ((*(byte *)(in_RDI + 0x2c8) & 1) == 0) {
    QtPrivate::QColorShower::setHsv
              ((QColorShower *)CONCAT44(v,in_stack_00000010),in_stack_0000000c,in_stack_00000008,
               unaff_retaddr);
    v_00 = (int)((ulong)in_RDI >> 0x20);
    QtPrivate::QColorPicker::setCol
              ((QColorPicker *)CONCAT44(in_ESI,in_EDX),in_stack_0000007c,in_stack_00000078);
    QtPrivate::QColorLuminancePicker::setCol
              ((QColorLuminancePicker *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe8,
               v_00);
  }
  return;
}

Assistant:

void QColorDialogPrivate::newHsv(int h, int s, int v)
{
    if (!nativeDialogInUse) {
        cs->setHsv(h, s, v);
        cp->setCol(h, s);
        lp->setCol(h, s, v);
    }
}